

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

int nni_copyin_str(char *s,void *v,size_t maxsz,nni_type t)

{
  int iVar1;
  size_t __n;
  
  iVar1 = 0x1e;
  if ((t == NNI_TYPE_STRING) &&
     ((__n = nni_strnlen((char *)v,maxsz), __n != maxsz ||
      (iVar1 = 3, *(char *)((long)v + (maxsz - 1)) == '\0')))) {
    memcpy(s,v,__n);
    s[__n] = '\0';
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_copyin_str(char *s, const void *v, size_t maxsz, nni_type t)
{
	size_t z;

	if (t != NNI_TYPE_STRING) {
		return (NNG_EBADTYPE);
	}
	z = nni_strnlen(v, maxsz);
	if (z == maxsz && ((char *) v)[maxsz - 1] != 0) {
		return (NNG_EINVAL); // too long
	}
	memcpy(s, v, z);
	s[z] = 0;
	return (0);
}